

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_message_field.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::csharp::MessageOneofFieldGenerator::GenerateParsingCode
          (MessageOneofFieldGenerator *this,Printer *printer)

{
  io::Printer::Print(printer,&(this->super_MessageFieldGenerator).super_FieldGeneratorBase.
                              variables_,
                     "$type_name$ subBuilder = new $type_name$();\nif ($has_property_check$) {\n  subBuilder.MergeFrom($property_name$);\n}\ninput.ReadMessage(subBuilder);\n$property_name$ = subBuilder;\n"
                    );
  return;
}

Assistant:

void MessageOneofFieldGenerator::GenerateParsingCode(io::Printer* printer) {
  // TODO(jonskeet): We may be able to do better than this
  printer->Print(
    variables_,
    "$type_name$ subBuilder = new $type_name$();\n"
    "if ($has_property_check$) {\n"
    "  subBuilder.MergeFrom($property_name$);\n"
    "}\n"
    "input.ReadMessage(subBuilder);\n" // No support of TYPE_GROUP
    "$property_name$ = subBuilder;\n");
}